

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_dest.c
# Opt level: O3

int mpt_string_dest(mpt_strdest *addr,int sep,char *descr)

{
  char cVar1;
  long lVar2;
  int *piVar3;
  ushort **ppuVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  char *end;
  char *local_38;
  
  uVar6 = (ulong)addr->change;
  if (uVar6 == 0) {
    uVar6 = 7;
  }
  else if (7 < addr->change) {
    piVar3 = __errno_location();
    *piVar3 = 0x22;
    return -1;
  }
  addr->change = '\0';
  if (descr == (char *)0x0) {
    iVar8 = 0;
  }
  else {
    ppuVar4 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar4 + (long)*descr * 2 + 1) & 0x20) == 0) {
      lVar9 = 0;
    }
    else {
      lVar9 = 0;
      do {
        lVar2 = lVar9 + 1;
        lVar9 = lVar9 + 1;
      } while ((*(byte *)((long)*ppuVar4 + (long)descr[lVar2] * 2 + 1) & 0x20) != 0);
      descr = descr + lVar9;
    }
    uVar7 = 0;
    do {
      uVar5 = strtol(descr,&local_38,0);
      if ((long)local_38 - (long)descr == 0) {
        if (*local_38 == '\0') {
          return (int)lVar9;
        }
        if (*local_38 != sep) {
          piVar3 = __errno_location();
          *piVar3 = 0x16;
          return -(int)lVar9;
        }
        lVar9 = lVar9 + 1;
        if ((*(byte *)((long)*ppuVar4 + (long)local_38[1] * 2 + 1) & 0x20) != 0) {
          return (int)lVar9;
        }
      }
      else {
        lVar9 = ((long)local_38 - (long)descr) + lVar9;
        iVar8 = (int)lVar9;
        if (0xff < uVar5) {
          piVar3 = __errno_location();
          *piVar3 = 0x22;
          return -iVar8;
        }
        addr->val[uVar7] = (uint8_t)uVar5;
        addr->change = addr->change | (byte)(1 << ((byte)uVar7 & 0x1f));
        cVar1 = *local_38;
        if ((long)cVar1 == 0) {
          return iVar8;
        }
        if (cVar1 != sep) {
          return iVar8;
        }
        if (((*ppuVar4)[cVar1] & 0x2000) != 0) {
          return iVar8;
        }
        lVar9 = lVar9 + 1;
        descr = local_38;
      }
      iVar8 = (int)lVar9;
      descr = descr + 1;
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return iVar8;
}

Assistant:

extern int mpt_string_dest(MPT_STRUCT(strdest) *addr, int sep, const char *descr)
{
	char *end;
	size_t pos = 0, max, i;
	long val;
	
	if (!(max = addr->change)) {
		max = sizeof(addr->val);
	}
	else if (max > sizeof(addr->val)) {
		errno = ERANGE; return -1;
	}
	addr->change = 0;
	
	if (!descr)
		return 0;
	
	while (isspace(*descr)) {
		pos++; descr++;
	}
	
	for (i = 0 ; i < max ; i++) {
		val = strtol(descr, &end, 0);
		if (end == descr) {
			if (!*end)
				break;
			
			if (sep && *end == sep) {
				descr++; pos++;
				if (isspace(end[1]))
					break;
				continue;
			}
			errno = EINVAL; return -pos;
		}
		pos += (end - descr);
		
		if (val < 0 || val > UINT8_MAX) {
			errno = ERANGE; return -pos;
		}
		addr->val[i] = val;
		addr->change |= 1 << i;
		
		if (!*(descr = end) || isspace(*descr) || sep != *descr)
			break;
		
		descr++; pos++;
	}
	return pos;
}